

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_initgamedialog.cpp
# Opt level: O1

void InitGameDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QArrayData *local_58;
  long local_50;
  long local_48;
  QArrayData *local_40;
  long local_38;
  long local_30;
  void *local_28;
  QArrayData **local_20;
  undefined1 *local_18;
  
  local_18 = (undefined1 *)&local_58;
  if (_c == IndexOfMethod) {
    if ((*_a[1] == sendPlayerNames) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if ((_c == InvokeMetaMethod) && (_id == 0)) {
    plVar1 = (long *)_a[1];
    local_40 = (QArrayData *)*plVar1;
    local_38 = plVar1[1];
    local_30 = plVar1[2];
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    plVar1 = (long *)_a[2];
    local_58 = (QArrayData *)*plVar1;
    local_50 = plVar1[1];
    local_48 = plVar1[2];
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_28 = (void *)0x0;
    local_20 = &local_40;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,8);
      }
    }
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,2,8);
      }
    }
  }
  return;
}

Assistant:

void InitGameDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<InitGameDialog *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->sendPlayerNames((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (InitGameDialog::*)(QString , QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InitGameDialog::sendPlayerNames)) {
                *result = 0;
                return;
            }
        }
    }
}